

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adios2_c_variable.cpp
# Opt level: O0

adios2_error
adios2_set_step_selection(adios2_variable *variable,size_t step_start,size_t step_count)

{
  pair *in_RDI;
  adios2_variable *unaff_retaddr;
  VariableBase *variableBase;
  pair<unsigned_long,_unsigned_long> local_70;
  pair *local_60;
  allocator local_41;
  string local_40 [32];
  unsigned_long local_20;
  unsigned_long local_18;
  pair *local_10;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_10 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_40,"for adios2_variable, in call to adios2_set_step_selection",&local_41);
  adios2::helper::CheckForNullptr<adios2_variable>
            (unaff_retaddr,(string *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_60 = local_10;
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
            (&local_70,&local_18,&local_20);
  adios2::core::VariableBase::SetStepSelection(local_10);
  return adios2_error_none;
}

Assistant:

adios2_error adios2_set_step_selection(adios2_variable *variable, const size_t step_start,
                                       const size_t step_count)
{
    try
    {
        adios2::helper::CheckForNullptr(variable, "for adios2_variable, in call to "
                                                  "adios2_set_step_selection");
        adios2::core::VariableBase *variableBase =
            reinterpret_cast<adios2::core::VariableBase *>(variable);
        variableBase->SetStepSelection(adios2::Box<size_t>{step_start, step_count});
        return adios2_error_none;
    }
    catch (...)
    {
        return static_cast<adios2_error>(adios2::helper::ExceptionToError("adios2_set_selection"));
    }
}